

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O0

char * unique_id(void *o,char *type,char *name,char *label)

{
  int iVar1;
  id *this;
  char *pcVar2;
  bool bVar3;
  int i;
  int which;
  id **p;
  char *n;
  char *q;
  char buffer [128];
  char *label_local;
  char *name_local;
  char *type_local;
  void *o_local;
  
  n = (char *)&q;
  name_local = type;
  while (*name_local != '\0') {
    *n = *name_local;
    n = n + 1;
    name_local = name_local + 1;
  }
  pcVar2 = n + 1;
  *n = '_';
  if ((name == (char *)0x0) || (p = (id **)name, *name == '\0')) {
    p = (id **)label;
  }
  n = pcVar2;
  if ((p != (id **)0x0) && (*(char *)p != '\0')) {
    while( true ) {
      bVar3 = false;
      if (*(char *)p != '\0') {
        iVar1 = is_id(*(char *)p);
        bVar3 = iVar1 == 0;
      }
      if (!bVar3) break;
      p = (id **)((long)p + 1);
    }
    while (iVar1 = is_id(*(char *)p), iVar1 != 0) {
      *n = *(char *)p;
      p = (id **)((long)p + 1);
      n = n + 1;
    }
  }
  *n = '\0';
  _i = &id_root;
  while( true ) {
    while( true ) {
      if (*_i == (id *)0x0) {
        this = (id *)operator_new(0x20);
        id::id(this,(char *)&q,o);
        *_i = this;
        return (*_i)->text;
      }
      iVar1 = strcmp((char *)&q,(*_i)->text);
      if (iVar1 == 0) break;
      if (iVar1 < 0) {
        _i = &(*_i)->left;
      }
      else {
        _i = &(*_i)->right;
      }
    }
    if ((*_i)->object == o) break;
    sprintf(n,"%x");
    _i = &id_root;
  }
  return (*_i)->text;
}

Assistant:

const char* unique_id(void* o, const char* type, const char* name, const char* label) {
  char buffer[128];
  char* q = buffer;
  while (*type) *q++ = *type++;
  *q++ = '_';
  const char* n = name;
  if (!n || !*n) n = label;
  if (n && *n) {
    while (*n && !is_id(*n)) n++;
    while (is_id(*n)) *q++ = *n++;
  }
  *q = 0;
  // okay, search the tree and see if the name was already used:
  id** p = &id_root;
  int which = 0;
  while (*p) {
    int i = strcmp(buffer, (*p)->text);
    if (!i) {
      if ((*p)->object == o) return (*p)->text;
      // already used, we need to pick a new name:
      sprintf(q,"%x",++which);
      p = &id_root;
      continue;
    }
    else if (i < 0) p = &((*p)->left);
    else p  = &((*p)->right);
  }
  *p = new id(buffer, o);
  return (*p)->text;
}